

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

Path * Pathie::Path::temp_dir(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  size_t sVar2;
  Path *in_RDI;
  _Alloc_hider _Var3;
  string nstr;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"TMPDIR","");
  utf8_to_filename(&local_40,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  __s = getenv(local_40._M_dataplus._M_p);
  if (__s == (char *)0x0) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"/tmp","");
    Path(in_RDI,&local_80);
    _Var3._M_p = local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_0010cdc6;
  }
  else {
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,__s,__s + sVar2);
    filename_to_utf8(&local_60,&local_a0);
    Path(in_RDI,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    _Var3._M_p = local_a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == paVar1) goto LAB_0010cdc6;
  }
  operator_delete(_Var3._M_p);
LAB_0010cdc6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

Path Path::temp_dir()
{
#if defined(_PATHIE_UNIX)
  std::string nstr = utf8_to_filename("TMPDIR"); // environment is encoded the same as paths
  char* env_value = NULL;

  if ((env_value = getenv(nstr.c_str()))) // Single = intended
    return Path(filename_to_utf8(env_value));


  return Path("/tmp"); // As per the Filesystem Hierarchy Standard.
#elif defined(_WIN32)
  wchar_t buf[MAX_PATH +1]; // See http://msdn.microsoft.com/en-us/library/windows/desktop/aa364992%28v=vs.85%29.aspx for the +1
  DWORD count = GetTempPathW(MAX_PATH + 1, buf);

  if (count == 0) {
    DWORD err = GetLastError();
    throw(Pathie::WindowsError(err));
  }

  std::wstring utf16(buf, count);
  return utf16_to_utf8(utf16);
#else
#error Unsupported system.
#endif
}